

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O2

QSize __thiscall QMdiArea::minimumSizeHint(QMdiArea *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  QStyle *pQVar7;
  QSize QVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  QMdiSubWindow *child;
  
  lVar1 = *(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  pQVar7 = QWidget::style((QWidget *)this);
  uVar5 = (**(code **)(*(long *)pQVar7 + 0xe0))(pQVar7,0x2d,0,this);
  pQVar7 = QWidget::style((QWidget *)this);
  uVar6 = (**(code **)(*(long *)pQVar7 + 0xe0))(pQVar7,0x1a,0,this);
  QVar8 = QAbstractScrollArea::minimumSizeHint((QAbstractScrollArea *)this);
  uVar11 = (ulong)QVar8 >> 0x20;
  uVar10 = (ulong)uVar5;
  if ((int)uVar5 <= QVar8.wd.m_i.m_i) {
    uVar10 = (ulong)QVar8 & 0xffffffff;
  }
  if (QVar8.ht.m_i.m_i < (int)uVar6) {
    uVar11 = (ulong)uVar6;
  }
  if ((*(int *)(lVar1 + 0x29c) == 1) && (*(int *)(lVar1 + 0x298) == 1)) {
    lVar2 = *(long *)(lVar1 + 0x360);
    lVar1 = *(long *)(lVar1 + 0x368);
    for (lVar12 = 0; lVar1 << 4 != lVar12; lVar12 = lVar12 + 0x10) {
      lVar3 = *(long *)(lVar2 + lVar12);
      if ((lVar3 == 0) || (*(int *)(lVar3 + 4) == 0)) {
        child = (QMdiSubWindow *)0x0;
      }
      else {
        child = *(QMdiSubWindow **)(lVar2 + 8 + lVar12);
      }
      bVar4 = sanityCheck(child,"QMdiArea::sizeHint");
      if (bVar4) {
        uVar9 = (**(code **)(*(long *)&child->super_QWidget + 0x78))(child);
        if ((int)uVar10 <= (int)uVar9) {
          uVar10 = uVar9 & 0xffffffff;
        }
        uVar5 = (uint)(uVar9 >> 0x20);
        if ((int)uVar5 < (int)(uint)uVar11) {
          uVar5 = (uint)uVar11;
        }
        uVar11 = (ulong)uVar5;
      }
    }
  }
  return (QSize)(uVar10 | uVar11 << 0x20);
}

Assistant:

QSize QMdiArea::minimumSizeHint() const
{
    Q_D(const QMdiArea);
    QSize size(style()->pixelMetric(QStyle::PM_MdiSubWindowMinimizedWidth, nullptr, this),
               style()->pixelMetric(QStyle::PM_TitleBarHeight, nullptr, this));
    size = size.expandedTo(QAbstractScrollArea::minimumSizeHint());
    if (!d->scrollBarsEnabled()) {
        for (QMdiSubWindow *child : d->childWindows) {
            if (!sanityCheck(child, "QMdiArea::sizeHint"))
                continue;
            size = size.expandedTo(child->minimumSizeHint());
        }
    }
    return size;
}